

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSet<unsigned_int>::GetNextRange
          (CharSet<unsigned_int> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  Char CVar4;
  undefined4 *puVar5;
  Char local_3a;
  int local_38;
  Char local_34;
  char16 offsetLessSearchCharStart;
  int index;
  char16 currentHighChar;
  char16 currentLowChar;
  Char *outHigherChar_local;
  Char *outLowerChar_local;
  CharSet<unsigned_int> *pCStack_18;
  Char searchCharStart_local;
  CharSet<unsigned_int> *this_local;
  
  _index = outHigherChar;
  outHigherChar_local = outLowerChar;
  outLowerChar_local._4_4_ = searchCharStart;
  pCStack_18 = this;
  if (outLowerChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x675,"(outLowerChar != nullptr)","outLowerChar != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (_index == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x676,"(outHigherChar != nullptr)","outHigherChar != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (outLowerChar_local._4_4_ < 0x110000) {
    offsetLessSearchCharStart = L'\x01';
    local_34 = L'\0';
    local_38 = CharToIndex(this,outLowerChar_local._4_4_);
    local_3a = RemoveOffset(this,outLowerChar_local._4_4_);
    while ((local_38 < 0x11 &&
           (bVar3 = CharSet<char16_t>::GetNextRange
                              (this->characterPlanes + local_38,local_3a,&offsetLessSearchCharStart,
                               &local_34), !bVar3))) {
      local_3a = L'\0';
      local_38 = local_38 + 1;
    }
    if (local_38 == 0x11) {
      this_local._7_1_ = false;
    }
    else {
      if ((ushort)local_34 < (ushort)offsetLessSearchCharStart) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x68d,"(currentHighChar >= currentLowChar)",
                           "currentHighChar >= currentLowChar");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      CVar4 = AddOffset(this,offsetLessSearchCharStart,local_38);
      *outHigherChar_local = CVar4;
      CVar4 = AddOffset(this,local_34,local_38);
      *_index = CVar4;
      while (((local_38 = local_38 + 1, local_38 < 0x11 &&
              (bVar3 = CharSet<char16_t>::GetNextRange
                                 (this->characterPlanes + local_38,L'\0',&offsetLessSearchCharStart,
                                  &local_34), bVar3)) &&
             (uVar1 = *_index, CVar4 = AddOffset(this,offsetLessSearchCharStart,local_38),
             uVar1 + 1 == CVar4))) {
        CVar4 = AddOffset(this,local_34,local_38);
        if (CVar4 <= *_index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0x69a,"(this->AddOffset(currentHighChar, index) > *outHigherChar)",
                             "this->AddOffset(currentHighChar, index) > *outHigherChar");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        CVar4 = AddOffset(this,local_34,local_38);
        *_index = CVar4;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CharSet<codepoint_t>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        Assert(outLowerChar != nullptr);
        Assert(outHigherChar != nullptr);
        if (searchCharStart >= 0x110000)
        {
            return false;
        }

        char16 currentLowChar = 1, currentHighChar = 0;
        int index = this->CharToIndex(searchCharStart);
        char16 offsetLessSearchCharStart = this->RemoveOffset(searchCharStart);

        for (; index < NumberOfPlanes; index++)
        {
            if (this->characterPlanes[index].GetNextRange(offsetLessSearchCharStart, &currentLowChar, &currentHighChar))
            {
                break;
            }
            offsetLessSearchCharStart = 0x0;
        }

        if (index == NumberOfPlanes)
        {
            return false;
        }
        Assert(currentHighChar >= currentLowChar);
        // else found range
        *outLowerChar = this->AddOffset(currentLowChar, index);
        *outHigherChar = this->AddOffset(currentHighChar, index);

        // Check if range crosses plane boundaries
        index ++;
        for (; index < NumberOfPlanes; index++)
        {
            if (!this->characterPlanes[index].GetNextRange(0x0, &currentLowChar, &currentHighChar) || *outHigherChar + 1 != this->AddOffset(currentLowChar, index))
            {
                break;
            }
            Assert(this->AddOffset(currentHighChar, index) > *outHigherChar);
            *outHigherChar = this->AddOffset(currentHighChar, index);
        }

        return true;
    }